

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmUmdTranslationTable.cpp
# Opt level: O1

uint8_t __thiscall
GmmLib::PageTable::GetMappingType
          (PageTable *this,GMM_GFX_ADDRESS GfxVA,GMM_GFX_SIZE_T Size,GMM_GFX_ADDRESS *LastAddr)

{
  uint uVar1;
  LastLevelTable *pLVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar6;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  undefined4 extraout_var_08;
  bool bVar7;
  bool bVar8;
  ulong uVar9;
  bool bVar10;
  uint local_a0;
  uint local_98;
  long local_60;
  ulong local_50;
  ulong local_48;
  GMM_GFX_ADDRESS local_40;
  ulong local_38;
  
  iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
  local_48 = 1;
  if ((*(byte *)(CONCAT44(extraout_var,iVar3) + 0x45) & 0x40) == 0) {
    iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
    local_48 = 4;
    if ((*(byte *)(CONCAT44(extraout_var_00,iVar3) + 0x45) & 0x80) == 0) {
      local_48 = 0x40;
    }
  }
  local_48 = ((uint)(GfxVA >> 0xe) & 0x3ff) / local_48;
  iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
  local_60 = 0x4000;
  if ((*(byte *)(CONCAT44(extraout_var_01,iVar3) + 0x45) & 0x40) == 0) {
    iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
    local_60 = 0x10000;
    if ((*(byte *)(CONCAT44(extraout_var_02,iVar3) + 0x45) & 0x80) == 0) {
      local_60 = 0x100000;
    }
  }
  local_50 = GfxVA >> 0x24 & 0xfff;
  local_38 = GfxVA >> 0x18 & 0xfff;
  pthread_mutex_lock((pthread_mutex_t *)&this->TTLock);
  bVar7 = false;
  bVar10 = false;
  bVar8 = false;
  local_40 = GfxVA;
  do {
    if ((bVar8) || (Size + GfxVA <= local_40)) {
      *LastAddr = local_40;
      break;
    }
    if (this->pTTL2[local_50].super_Table.PoolElem == (GMM_PAGETABLEPool *)0x0) {
      if (bVar10 == false) {
        iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
        uVar4 = *(uint *)(CONCAT44(extraout_var_06,iVar3) + 0x44);
        if (local_40 == GfxVA) {
          uVar9 = 1;
          if ((uVar4 >> 0xe & 1) == 0) {
            iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
            uVar9 = 4;
            if ((*(byte *)(CONCAT44(extraout_var_07,iVar3) + 0x45) & 0x80) == 0) {
              uVar9 = 0x40;
            }
          }
          uVar9 = (ulong)(0x1000 - (int)local_38) * (ulong)((int)(0x400 / uVar9) - (uint)local_48);
        }
        else {
          uVar9 = 1;
          if ((uVar4 >> 0xe & 1) == 0) {
            iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
            uVar9 = 4;
            if ((*(byte *)(CONCAT44(extraout_var_08,iVar3) + 0x45) & 0x80) == 0) {
              uVar9 = 0x40;
            }
          }
          uVar9 = (ulong)(uint)((int)(0x400 / uVar9) << 0xc);
        }
        local_40 = local_40 + uVar9 * local_60;
LAB_001c5525:
        local_50 = local_50 + 1;
        if (local_50 == 0x1000) {
          bVar8 = true;
        }
        local_38 = 0;
LAB_001c5557:
        local_48 = 0;
        bVar10 = false;
      }
      else {
        *LastAddr = local_40;
        bVar10 = true;
        bVar7 = true;
      }
    }
    else {
      for (pLVar2 = this->pTTL2[local_50].pTTL1;
          (pLVar2 != (LastLevelTable *)0x0 && (local_38 != (long)(int)pLVar2->L2eIdx));
          pLVar2 = pLVar2->pNext) {
      }
      if ((pLVar2 == (LastLevelTable *)0x0) ||
         ((pLVar2->super_Table).PoolElem == (GMM_PAGETABLEPool *)0x0)) {
        if (bVar10 == false) {
          iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
          uVar9 = 1;
          if ((*(byte *)(CONCAT44(extraout_var_04,iVar3) + 0x45) & 0x40) == 0) {
            iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
            uVar9 = 4;
            if ((*(byte *)(CONCAT44(extraout_var_05,iVar3) + 0x45) & 0x80) == 0) {
              uVar9 = 0x40;
            }
          }
          if (local_40 != GfxVA) {
            local_48 = 0;
          }
          local_40 = local_40 + (0x400 / uVar9 - local_48) * local_60;
          local_38 = local_38 + 1;
          if (local_38 == 0x1000) goto LAB_001c5525;
          goto LAB_001c5557;
        }
        *LastAddr = local_40;
        bVar10 = true;
        bVar7 = true;
      }
      else if (!bVar7) {
        uVar4 = (uint)local_48 & 0x1f;
        uVar9 = local_48 >> 5;
        do {
          iVar3 = (*this->pClientContext->_vptr_GmmClientContext[3])();
          uVar6 = 0x20;
          if ((*(byte *)(CONCAT44(extraout_var_03,iVar3) + 0x45) & 0x40) == 0) {
            uVar6 = 8;
          }
          if (uVar6 <= uVar9) {
            local_38 = local_38 + 1;
            if (local_38 == 0x1000) {
              local_50 = local_50 + 1;
              if (local_50 == 0x1000) {
                bVar8 = true;
              }
              local_48 = 0;
              local_38 = 0;
            }
            else {
              local_48 = 0;
            }
            break;
          }
          uVar1 = (pLVar2->super_Table).UsedEntries[uVar9];
          if (local_40 == GfxVA) {
            local_a0 = (uint)(1L << ((byte)local_48 & 0x1f));
            bVar10 = (local_a0 & uVar1) != 0;
            local_98 = (uint)(-1L << (char)uVar4 + 1);
            local_98 = (-(uint)bVar10 ^ uVar1) & local_98;
            uVar6 = (ulong)(0x20 - uVar4);
            uVar5 = uVar4;
          }
          else {
            uVar5 = 0;
            local_98 = -(uint)(bVar10 != false) ^ uVar1;
            uVar6 = 0x20;
          }
          iVar3 = 0;
          if (local_98 != 0) {
            for (; (local_98 >> iVar3 & 1) == 0; iVar3 = iVar3 + 1) {
            }
          }
          if (local_98 != 0) {
            *LastAddr = (ulong)(iVar3 - uVar5) * local_60 + local_40;
            bVar7 = true;
          }
          else {
            local_40 = local_40 + uVar6 * local_60;
          }
          uVar9 = uVar9 + 1;
        } while (!bVar7);
      }
    }
  } while (!bVar7);
  pthread_mutex_unlock((pthread_mutex_t *)&this->TTLock);
  return bVar10;
}

Assistant:

uint8_t GmmLib::PageTable::GetMappingType(GMM_GFX_ADDRESS GfxVA, GMM_GFX_SIZE_T Size, GMM_GFX_ADDRESS &LastAddr)
{
    GMM_GFX_SIZE_T  L3eIdx, L2eIdx, L1eIdx, L1EntrySize;
    uint32_t        L1Size, L2Size;
    uint8_t         MapType      = 0; //true for non-null, false for null mapped
    bool            bFoundLastVA = false, bTerminate = false;
    GMM_GFX_ADDRESS TileAddr = GfxVA;

    L3eIdx      = GMM_L3_ENTRY_IDX(TTType, GfxVA);
    L2eIdx      = GMM_L2_ENTRY_IDX(TTType, GfxVA);
    L1eIdx      = GMM_L1_ENTRY_IDX(TTType, GfxVA, GetGmmLibContext());
    L1EntrySize = WA16K(GetGmmLibContext()) ? GMM_KBYTE(16) : WA64K(GetGmmLibContext()) ? GMM_KBYTE(64) : GMM_MBYTE(1);

    EnterCriticalSection(&TTLock);
    __GMM_ASSERT(TTL3.L3Handle);

#define GET_NEXT_L1TABLE(L1eIdx, L2eIdx, L3eIdx) \
    {                                            \
        L1eIdx = 0;                              \
        L2eIdx++;                                \
        if(L2eIdx == (GMM_L2_SIZE(TTType)))      \
        {                                        \
            L2eIdx = 0;                          \
            L3eIdx++;                            \
            if(L3eIdx == (GMM_L3_SIZE(TTType)))  \
            {                                    \
                bTerminate = true;               \
            }                                    \
        }                                        \
    }

#define GET_NEXT_L2TABLE(L1eIdx, L2eIdx, L3eIdx) \
    {                                            \
        L1eIdx = L2eIdx = 0;                     \
        L3eIdx++;                                \
        if(L3eIdx == (GMM_L3_SIZE(TTType)))      \
        {                                        \
            bTerminate = true;                   \
        }                                        \
    }

    while(!(bFoundLastVA || bTerminate) && (TileAddr < GfxVA + Size))
    {
        if(pTTL2[L3eIdx].GetPool())
        {
            GmmLib::LastLevelTable *pL1Tbl = NULL;
            pL1Tbl                         = pTTL2[L3eIdx].GetL1Table(L2eIdx);
            if(pL1Tbl && pL1Tbl->GetPool())
            {
                uint32_t LastBit = 0;
                uint32_t i       = static_cast<uint32_t>(L1eIdx) / 32;

                while(!bFoundLastVA && i < (uint32_t)(GMM_L1_SIZE_DWORD(TTType, GetGmmLibContext())))
                {
                    uint32_t UsageDW = pL1Tbl->GetUsedEntries()[i++];
                    uint32_t BitNum  = 31;
                    if(GfxVA == TileAddr)
                    {
                        BitNum  = L1eIdx % 32;
                        MapType = ((UsageDW & __BIT(BitNum)) ? 0x1 : 0x0); //true for non-null, false for null mapped
                        UsageDW = (!MapType) ? UsageDW : ~UsageDW;
                        UsageDW = ((uint64_t)UsageDW >> (BitNum + 1)) << (BitNum + 1); // clear lsb <= BitNum
                    }
                    else
                    {
                        UsageDW = (!MapType) ? UsageDW : ~UsageDW;
                    }

                    if(_BitScanForward((uint32_t *)&LastBit, UsageDW)) // Gets lsb > BitNum, having reverse mapType
                    {
                        bFoundLastVA      = true;
                        uint32_t NumTiles = (GfxVA == TileAddr) ? (LastBit - BitNum) : LastBit;
                        LastAddr          = TileAddr + NumTiles * L1EntrySize;
                    }
                    else
                    {
                        uint32_t NumTiles = (GfxVA == TileAddr) ? (32 - BitNum) : 32;
                        TileAddr += NumTiles * L1EntrySize;
                    }
                }
                if(!bFoundLastVA)
                {
                    GET_NEXT_L1TABLE(L1eIdx, L2eIdx, L3eIdx);
                }
            }
            else //L2Entry is NULL
            {
                if(MapType) //First hit null-map
                {
                    LastAddr     = TileAddr;
                    bFoundLastVA = true;
                }
                else
                {
                    GMM_GFX_SIZE_T NumTiles = GMM_L1_USABLESIZE(TTType, GetGmmLibContext());			
                    if(GfxVA == TileAddr)
                    {
                        MapType = false;
                        NumTiles -= L1eIdx;
                    }
                    TileAddr += NumTiles * L1EntrySize;
                    GET_NEXT_L1TABLE(L1eIdx, L2eIdx, L3eIdx)
                }
            }
        }
        else //L3entry is NULL
        {
            if(MapType) //First hit null-map
            {
                LastAddr     = TileAddr;
                bFoundLastVA = true;
            }
            else
            {
                GMM_GFX_SIZE_T NumTiles = 0;
                if(GfxVA == TileAddr)
                {
                    MapType  = false;
                    L1Size   = GMM_L1_USABLESIZE(TTType, GetGmmLibContext()) - L1eIdx;
                    L2Size   = GMM_L2_SIZE(TTType) - L2eIdx;
                    NumTiles = ((uint64_t)L1Size * L2Size);
                }
                else
                {
                    L1Size   = GMM_L1_USABLESIZE(TTType, GetGmmLibContext());
                    L2Size   = GMM_L2_SIZE(TTType);
                    NumTiles = ((uint64_t)L1Size * L2Size);
                }
                TileAddr += NumTiles * L1EntrySize;
                GET_NEXT_L2TABLE(L1eIdx, L2eIdx, L3eIdx)
            }
        }
    }

    if(!bFoundLastVA)
    {
        LastAddr = TileAddr;
    }

    LeaveCriticalSection(&TTLock);
    return MapType;
}